

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

void subwindows_set_flags(uint32_t *new_flags,size_t n_subwindows)

{
  term *ptVar1;
  uint uVar2;
  term *t;
  uint uVar3;
  uint uVar4;
  term *ptVar5;
  code *pcVar6;
  undefined8 uVar7;
  game_event_type *pgVar8;
  long lVar9;
  int iVar10;
  size_t sVar11;
  char **ppcVar12;
  code *pcVar13;
  
  if (n_subwindows != 0) {
    sVar11 = 0;
    do {
      t = Term;
      if ((angband_term[sVar11] != (term *)0x0) &&
         (uVar2 = new_flags[sVar11], window_flag[sVar11] != uVar2)) {
        iVar10 = (int)sVar11;
        ptVar1 = (term *)(minimap_data + iVar10);
        ppcVar12 = window_flag_desc;
        lVar9 = 0;
        do {
          if (*ppcVar12 == (char *)0x0) goto switchD_001c1394_caseD_3;
          uVar3 = 1 << ((byte)lVar9 & 0x1f);
          uVar4 = uVar3 & uVar2;
          if (uVar4 == (window_flag[iVar10] & uVar3)) goto switchD_001c1394_caseD_3;
          pcVar13 = event_add_handler;
          if (uVar4 == 0) {
            pcVar13 = event_remove_handler;
          }
          pcVar6 = event_add_handler_set;
          if (uVar4 == 0) {
            pcVar6 = event_remove_handler_set;
          }
          if (0x7f < (int)uVar3) {
            if ((int)uVar3 < 0x400) {
              if (uVar3 == 0x80) {
                (*pcVar13)(0,update_maps,angband_term[iVar10]);
                ptVar5 = angband_term[iVar10];
                uVar7 = 0x40;
                pcVar6 = flush_subwindow;
              }
              else if (uVar3 == 0x100) {
                ptVar5 = angband_term[iVar10];
                uVar7 = 0x1c;
                pcVar6 = update_monster_subwindow;
              }
              else {
                if (uVar3 != 0x200) goto switchD_001c1394_caseD_3;
                ptVar5 = angband_term[iVar10];
                uVar7 = 0x1d;
                pcVar6 = update_object_subwindow;
              }
            }
            else if (uVar3 == 0x400) {
              ptVar5 = angband_term[iVar10];
              uVar7 = 0x1b;
              pcVar6 = update_monlist_subwindow;
            }
            else {
              if (uVar3 != 0x1000) {
                if (uVar3 == 0x2000) {
                  (*pcVar6)(player_events,0xd,update_topbar_subwindow,angband_term[iVar10]);
                  ptVar5 = angband_term[iVar10];
                  uVar7 = 6;
                  pgVar8 = statusline_events;
                  pcVar13 = update_topbar_subwindow;
                  goto LAB_001c1501;
                }
                goto switchD_001c1394_caseD_3;
              }
              ptVar5 = angband_term[iVar10];
              uVar7 = 0x1a;
              pcVar6 = update_itemlist_subwindow;
            }
            goto LAB_001c15b4;
          }
          if (0xf < (int)uVar3) {
            if (uVar3 == 0x10) {
              ptVar5 = angband_term[iVar10];
              uVar7 = 0xd;
              pgVar8 = player_events;
              pcVar13 = update_player_compact_subwindow;
              goto LAB_001c1501;
            }
            if (uVar3 == 0x20) {
              *(int *)&ptVar1->user = iVar10;
              (*pcVar13)(0,update_minimap_subwindow);
              (*pcVar13)(10,update_minimap_subwindow,ptVar1);
              uVar7 = 0x40;
              pcVar6 = update_minimap_subwindow;
              ptVar5 = ptVar1;
            }
            else {
              if (uVar3 != 0x40) goto switchD_001c1394_caseD_3;
              uVar7 = 0x12;
              pcVar6 = update_messages_subwindow;
              ptVar5 = angband_term[iVar10];
            }
            goto LAB_001c15b4;
          }
          switch(uVar3) {
          case 1:
            ptVar5 = angband_term[iVar10];
            uVar7 = 0x18;
            pcVar6 = update_inven_subwindow;
            break;
          case 2:
            ptVar5 = angband_term[iVar10];
            uVar7 = 0x19;
            pcVar6 = update_equip_subwindow;
            break;
          default:
            goto switchD_001c1394_caseD_3;
          case 4:
            ptVar5 = angband_term[iVar10];
            uVar7 = 0xd;
            pgVar8 = player_events;
            pcVar13 = update_player0_subwindow;
            goto LAB_001c1501;
          case 8:
            ptVar5 = angband_term[iVar10];
            uVar7 = 0xd;
            pgVar8 = player_events;
            pcVar13 = update_player1_subwindow;
LAB_001c1501:
            (*pcVar6)(pgVar8,uVar7,pcVar13,ptVar5);
            goto switchD_001c1394_caseD_3;
          }
LAB_001c15b4:
          (*pcVar13)(uVar7,pcVar6,ptVar5);
switchD_001c1394_caseD_3:
          lVar9 = lVar9 + 1;
          ppcVar12 = ppcVar12 + 1;
        } while (lVar9 != 0x20);
        window_flag[iVar10] = uVar2;
        Term_activate(angband_term[iVar10]);
        Term_clear();
        Term_fresh();
        Term_activate(t);
      }
      sVar11 = sVar11 + 1;
    } while (sVar11 != n_subwindows);
  }
  return;
}

Assistant:

void subwindows_set_flags(uint32_t *new_flags, size_t n_subwindows)
{
	size_t j;

	for (j = 0; j < n_subwindows; j++) {
		/* Dead window */
		if (!angband_term[j]) continue;

		/* Ignore non-changes */
		if (window_flag[j] != new_flags[j])
			subwindow_set_flags(j, new_flags[j]);
	}
}